

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O2

void * __thiscall
cbtSortedOverlappingPairCache::removeOverlappingPair
          (cbtSortedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          ,cbtDispatcher *dispatcher)

{
  int *piVar1;
  cbtBroadphasePair *pcVar2;
  void *pvVar3;
  cbtOverlappingPairCallback *pcVar4;
  int iVar5;
  cbtBroadphasePair findPair;
  cbtBroadphasePair local_50;
  
  iVar5 = (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
            _vptr_cbtOverlappingPairCallback[0xf])();
  if ((char)iVar5 == '\0') {
    local_50.m_pProxy1 = proxy0;
    local_50.m_pProxy0 = proxy1;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      local_50.m_pProxy1 = proxy1;
      local_50.m_pProxy0 = proxy0;
    }
    local_50.m_algorithm = (cbtCollisionAlgorithm *)0x0;
    local_50.field_3.m_internalInfo1 = (void *)0x0;
    iVar5 = cbtAlignedObjectArray<cbtBroadphasePair>::findLinearSearch
                      (&this->m_overlappingPairArray,&local_50);
    if (iVar5 < (this->m_overlappingPairArray).m_size) {
      pcVar2 = (this->m_overlappingPairArray).m_data;
      pvVar3 = pcVar2[iVar5].field_3.m_internalInfo1;
      (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
        _vptr_cbtOverlappingPairCallback[8])(this,pcVar2 + iVar5);
      pcVar4 = this->m_ghostPairCallback;
      if (pcVar4 != (cbtOverlappingPairCallback *)0x0) {
        (*pcVar4->_vptr_cbtOverlappingPairCallback[3])(pcVar4,proxy0,proxy1,dispatcher);
      }
      cbtAlignedObjectArray<cbtBroadphasePair>::swap
                (&this->m_overlappingPairArray,iVar5,(this->m_overlappingPairArray).m_capacity + -1)
      ;
      piVar1 = &(this->m_overlappingPairArray).m_size;
      *piVar1 = *piVar1 + -1;
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void* cbtSortedOverlappingPairCache::removeOverlappingPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1, cbtDispatcher* dispatcher)
{
	if (!hasDeferredRemoval())
	{
		cbtBroadphasePair findPair(*proxy0, *proxy1);

		int findIndex = m_overlappingPairArray.findLinearSearch(findPair);
		if (findIndex < m_overlappingPairArray.size())
		{
			cbtBroadphasePair& pair = m_overlappingPairArray[findIndex];
			void* userData = pair.m_internalInfo1;
			cleanOverlappingPair(pair, dispatcher);
			if (m_ghostPairCallback)
				m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1, dispatcher);

			m_overlappingPairArray.swap(findIndex, m_overlappingPairArray.capacity() - 1);
			m_overlappingPairArray.pop_back();
			return userData;
		}
	}

	return 0;
}